

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

size_t __thiscall llvm::raw_fd_ostream::preferred_buffer_size(raw_fd_ostream *this)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat statbuf;
  raw_fd_ostream *this_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)this;
  if (this->FD < 0) {
    __assert_fail("FD >= 0 && \"File not yet open!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x2bd,"virtual size_t llvm::raw_fd_ostream::preferred_buffer_size() const");
  }
  iVar1 = fstat(this->FD,(stat *)local_a8);
  if (iVar1 == 0) {
    if ((((uint)statbuf.st_nlink & 0xf000) == 0x2000) && (iVar1 = isatty(this->FD), iVar1 != 0)) {
      this_local = (raw_fd_ostream *)0x0;
    }
    else {
      this_local = (raw_fd_ostream *)statbuf.st_size;
    }
  }
  else {
    this_local = (raw_fd_ostream *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t raw_fd_ostream::preferred_buffer_size() const {
#if !defined(_MSC_VER) && !defined(__MINGW32__) && !defined(__minix)
  // Windows and Minix have no st_blksize.
  assert(FD >= 0 && "File not yet open!");
  struct stat statbuf;
  if (fstat(FD, &statbuf) != 0)
    return 0;

  // If this is a terminal, don't use buffering. Line buffering
  // would be a more traditional thing to do, but it's not worth
  // the complexity.
  if (S_ISCHR(statbuf.st_mode) && isatty(FD))
    return 0;
  // Return the preferred block size.
  return statbuf.st_blksize;
#else
  return raw_ostream::preferred_buffer_size();
#endif
}